

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O0

LispPTR CHAR_bin(int fd,LispPTR errn)

{
  int iVar1;
  LispPTR *pLVar2;
  int *piVar3;
  bool bVar4;
  uint local_2c;
  uint local_28;
  byte local_24 [4];
  ssize_t sStack_20;
  uchar ch [4];
  ssize_t rval;
  LispPTR errn_local;
  int fd_local;
  
  Lisp_errno = (int *)NativeAligned4FromLAddr(errn);
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    if ((fd & 0xfff0000U) == 0xe0000) {
      local_28 = fd & 0xffff;
    }
    else {
      if ((fd & 0xfff0000U) == 0xf0000) {
        local_2c = fd | 0xffff0000;
      }
      else {
        pLVar2 = NativeAligned4FromLAddr(fd);
        local_2c = *pLVar2;
      }
      local_28 = local_2c;
    }
    alarm(TIMEOUT_TIME);
    do {
      piVar3 = __errno_location();
      *piVar3 = 0;
      sStack_20 = read(local_28,local_24,1);
      bVar4 = false;
      if (sStack_20 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    alarm(0);
    if (sStack_20 == 0) {
      *Lisp_errno = 0xb;
      errn_local = 0;
    }
    else if (sStack_20 == -1) {
      piVar3 = __errno_location();
      *Lisp_errno = *piVar3;
      errn_local = 0;
    }
    else {
      errn_local = GetPosSmallp((ulong)local_24[0]);
    }
  }
  else {
    *Lisp_errno = 100;
    errn_local = 0;
  }
  return errn_local;
}

Assistant:

LispPTR CHAR_bin(int fd, LispPTR errn)
{
#ifndef DOS
  ssize_t rval;
  unsigned char ch[4];
  Lisp_errno = (int *)NativeAligned4FromLAddr(errn);
  ERRSETJMP(NIL);
  fd = LispNumToCInt(fd);

  TIMEOUT(rval = read(fd, ch, 1));
  if (rval == 0) {
    *Lisp_errno = EWOULDBLOCK;
    return (NIL);
  }
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
  return (GetPosSmallp(ch[0]));
#endif /* DOS */
}